

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

void QtGuiTest::synthesizeWheelEvent(int rollCount,KeyboardModifiers modifiers)

{
  bool bVar1;
  QDebug *pQVar2;
  QPoint QVar3;
  char *t;
  long in_FS_OFFSET;
  QPointF local_70;
  QPointF local_60;
  undefined4 uStack_50;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_60.xp._0_4_ = 2;
    local_60.xp._4_4_ = 0;
    local_60.yp._0_4_ = 0;
    local_60.yp._4_4_ = 0;
    uStack_50 = 0;
    local_4c = 0;
    local_48 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_70,"Synthesizing wheel event:");
    pQVar2 = QDebug::operator<<(pQVar2,rollCount);
    local_40.stream = pQVar2->stream;
    (local_40.stream)->ref = (local_40.stream)->ref + 1;
    operator<<<QFlags<Qt::KeyboardModifier>,_true>
              ((Stream *)local_38,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(&local_40,0));
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug((QDebug *)&local_70);
  }
  QVar3 = QCursor::pos();
  local_70.xp = (qreal)QVar3.xp.m_i.m_i;
  local_70.yp = (qreal)QVar3.yp.m_i.m_i;
  local_60.xp = local_70.xp;
  local_60.yp = local_70.yp;
  bVar1 = QWindowSystemInterface::handleWheelEvent
                    ((QWindow *)0x0,&local_60,&local_70,(QPoint)0x0,
                     (QPoint)((ulong)(uint)-rollCount << 0x20),modifiers,NoScrollPhase,
                     MouseEventNotSynthesized);
  if (bVar1) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_002ee98d;
    local_60.xp._0_4_ = 2;
    local_60.xp._4_4_ = 0;
    local_60.yp._0_4_ = 0;
    local_60.yp._4_4_ = 0;
    uStack_50 = 0;
    local_4c = 0;
    local_48 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
    t = "(success)";
  }
  else {
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_002ee98d;
    local_60.xp._0_4_ = 2;
    local_60.xp._4_4_ = 0;
    local_60.yp._0_4_ = 0;
    local_60.yp._4_4_ = 0;
    uStack_50 = 0;
    local_4c = 0;
    local_48 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
    t = "(failure)";
  }
  QDebug::operator<<((QDebug *)&local_70,t);
  QDebug::~QDebug((QDebug *)&local_70);
LAB_002ee98d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtGuiTest::synthesizeWheelEvent(int rollCount, Qt::KeyboardModifiers modifiers)
{
    deb << "Synthesizing wheel event:" << rollCount << modifiers;

    QPoint position = QCursor::pos();
    if (QWindowSystemInterface::handleWheelEvent(nullptr, position, position,
                                                 QPoint(), QPoint(0, -rollCount), modifiers)) {

        // It's unlikely that a shortcut relates to a subsequent wheel event.
        // But it's not harmful, to send posted events here.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }
}